

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHie.c
# Opt level: O1

Abc_Ntk_t * Abc_NtkInsertNewLogic(Abc_Ntk_t *pNtkH,Abc_Ntk_t *pNtkL)

{
  void *pvVar1;
  long *plVar2;
  Abc_Des_t *pAVar3;
  void **ppvVar4;
  uint uVar5;
  int iVar6;
  Abc_Ntk_t *pNtk;
  char *pcVar7;
  Abc_Obj_t *pAVar8;
  Abc_Obj_t *pAVar9;
  Abc_Obj_t *pAVar10;
  char *pcVar11;
  Vec_Ptr_t *pVVar12;
  long lVar13;
  long lVar14;
  
  if (pNtkH->ntkType != ABC_NTK_NETLIST) {
    __assert_fail("Abc_NtkIsNetlist(pNtkH)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcHie.c"
                  ,0x2ba,"Abc_Ntk_t *Abc_NtkInsertNewLogic(Abc_Ntk_t *, Abc_Ntk_t *)");
  }
  if (pNtkH->nObjCounts[9] != 0) {
    __assert_fail("Abc_NtkWhiteboxNum(pNtkH) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcHie.c"
                  ,699,"Abc_Ntk_t *Abc_NtkInsertNewLogic(Abc_Ntk_t *, Abc_Ntk_t *)");
  }
  if (pNtkH->nObjCounts[10] < 1) {
    __assert_fail("Abc_NtkBlackboxNum(pNtkH) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcHie.c"
                  ,700,"Abc_Ntk_t *Abc_NtkInsertNewLogic(Abc_Ntk_t *, Abc_Ntk_t *)");
  }
  if (pNtkL->ntkType != ABC_NTK_NETLIST) {
    __assert_fail("Abc_NtkIsNetlist(pNtkL)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcHie.c"
                  ,0x2be,"Abc_Ntk_t *Abc_NtkInsertNewLogic(Abc_Ntk_t *, Abc_Ntk_t *)");
  }
  if (pNtkL->nObjCounts[9] != 0) {
    __assert_fail("Abc_NtkWhiteboxNum(pNtkL) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcHie.c"
                  ,0x2bf,"Abc_Ntk_t *Abc_NtkInsertNewLogic(Abc_Ntk_t *, Abc_Ntk_t *)");
  }
  if (pNtkL->nObjCounts[10] != 0) {
    __assert_fail("Abc_NtkBlackboxNum(pNtkL) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcHie.c"
                  ,0x2c0,"Abc_Ntk_t *Abc_NtkInsertNewLogic(Abc_Ntk_t *, Abc_Ntk_t *)");
  }
  Abc_NtkCleanCopy(pNtkL);
  pNtk = Abc_NtkAlloc(pNtkL->ntkType,pNtkL->ntkFunc,1);
  pcVar7 = Extra_UtilStrsav(pNtkH->pName);
  pNtk->pName = pcVar7;
  pcVar7 = Extra_UtilStrsav(pNtkH->pSpec);
  pNtk->pSpec = pcVar7;
  pVVar12 = pNtkH->vPis;
  if (0 < pVVar12->nSize) {
    lVar14 = 0;
    do {
      pAVar9 = *(Abc_Obj_t **)
                (*(long *)(*(long *)(*pVVar12->pArray[lVar14] + 0x20) + 8) +
                (long)**(int **)((long)pVVar12->pArray[lVar14] + 0x30) * 8);
      pcVar7 = Abc_ObjName(pAVar9);
      pAVar8 = Abc_NtkFindNet(pNtkL,pcVar7);
      if ((pAVar8 == (Abc_Obj_t *)0x0) ||
         ((*(uint *)((long)pAVar8->pNtk->vObjs->pArray[*(pAVar8->vFanins).pArray] + 0x14) & 0xf) !=
          2)) {
        pcVar7 = Abc_ObjName(pAVar9);
        pcVar11 = "Error in Abc_NtkInsertNewLogic(): There is no PI corresponding to the PI %s.\n";
        goto LAB_0085b4ab;
      }
      pvVar1 = (pAVar8->field_6).pTemp;
      pcVar7 = Abc_ObjName(pAVar9);
      if (pvVar1 != (void *)0x0) {
        pcVar11 = "Error in Abc_NtkInsertNewLogic(): Primary input %s is repeated twice.\n";
        goto LAB_0085b4ab;
      }
      pAVar9 = Abc_NtkFindOrCreateNet(pNtk,pcVar7);
      (pAVar8->field_6).pCopy = pAVar9;
      Abc_NtkDupObj(pNtk,(Abc_Obj_t *)pAVar8->pNtk->vObjs->pArray[*(pAVar8->vFanins).pArray],0);
      lVar14 = lVar14 + 1;
      pVVar12 = pNtkH->vPis;
    } while (lVar14 < pVVar12->nSize);
  }
  pVVar12 = pNtkH->vBoxes;
  if (0 < pVVar12->nSize) {
    lVar14 = 0;
    do {
      pAVar9 = (Abc_Obj_t *)pVVar12->pArray[lVar14];
      if ((*(uint *)&pAVar9->field_0x14 & 0xf) == 10) {
        Abc_NtkDupBox(pNtk,pAVar9,0);
        ((pAVar9->field_6).pCopy)->field_5 = pAVar9->field_5;
        if (0 < (pAVar9->vFanouts).nSize) {
          lVar13 = 0;
          do {
            plVar2 = (long *)pAVar9->pNtk->vObjs->pArray[(pAVar9->vFanouts).pArray[lVar13]];
            pAVar8 = *(Abc_Obj_t **)
                      (*(long *)(*(long *)(*plVar2 + 0x20) + 8) + (long)*(int *)plVar2[6] * 8);
            pcVar7 = Abc_ObjName(pAVar8);
            pAVar10 = Abc_NtkFindNet(pNtkL,pcVar7);
            if ((pAVar10 == (Abc_Obj_t *)0x0) ||
               ((*(uint *)((long)pAVar10->pNtk->vObjs->pArray[*(pAVar10->vFanins).pArray] + 0x14) &
                0xf) != 2)) {
              pcVar7 = Abc_ObjName(pAVar8);
              pcVar11 = Abc_ObjName(pAVar9);
              printf("Error in Abc_NtkInsertNewLogic(): There is no PI corresponding to the inpout %s of blackbox %s.\n"
                     ,pcVar7,pcVar11);
              goto LAB_0085b4b5;
            }
            pvVar1 = (pAVar10->field_6).pTemp;
            pcVar7 = Abc_ObjName(pAVar8);
            if (pvVar1 != (void *)0x0) {
              printf("Error in Abc_NtkInsertNewLogic(): Box output %s is repeated twice.\n",pcVar7);
              goto LAB_0085b4b5;
            }
            pAVar8 = Abc_NtkFindOrCreateNet(pNtk,pcVar7);
            (pAVar10->field_6).pCopy = pAVar8;
            *(long *)((long)pAVar10->pNtk->vObjs->pArray[*(pAVar10->vFanins).pArray] + 0x40) =
                 plVar2[8];
            lVar13 = lVar13 + 1;
          } while (lVar13 < (pAVar9->vFanouts).nSize);
        }
      }
      lVar14 = lVar14 + 1;
      pVVar12 = pNtkH->vBoxes;
    } while (lVar14 < pVVar12->nSize);
  }
  pVVar12 = pNtkH->vPos;
  if (pVVar12->nSize < 1) {
LAB_0085b192:
    pVVar12 = pNtkH->vBoxes;
    if (0 < pVVar12->nSize) {
      lVar14 = 0;
      do {
        pAVar9 = (Abc_Obj_t *)pVVar12->pArray[lVar14];
        if (((*(uint *)&pAVar9->field_0x14 & 0xf) == 10) && (0 < (pAVar9->vFanins).nSize)) {
          lVar13 = 0;
          do {
            plVar2 = (long *)pAVar9->pNtk->vObjs->pArray[(pAVar9->vFanins).pArray[lVar13]];
            pAVar8 = *(Abc_Obj_t **)
                      (*(long *)(*(long *)(*plVar2 + 0x20) + 8) + (long)*(int *)plVar2[4] * 8);
            Abc_ObjName(pAVar8);
            pcVar7 = Abc_ObjName(pAVar8);
            pAVar10 = Abc_NtkFindNet(pNtkL,pcVar7);
            if ((pAVar10 == (Abc_Obj_t *)0x0) ||
               (pvVar1 = pAVar10->pNtk->vObjs->pArray[*(pAVar10->vFanouts).pArray],
               (*(uint *)((long)pvVar1 + 0x14) & 0xf) != 3)) {
              pcVar7 = Abc_ObjName(pAVar8);
              pcVar11 = Abc_ObjName(pAVar9);
              printf("There is no PO corresponding to the input %s of blackbox %s.\n",pcVar7,pcVar11
                    );
              Abc_NtkDelete(pNtk);
              iVar6 = 1;
            }
            else if ((pAVar10->field_6).pCopy == (Abc_Obj_t *)0x0) {
              pcVar7 = Abc_ObjName(pAVar8);
              pAVar8 = Abc_NtkFindOrCreateNet(pNtk,pcVar7);
              (pAVar10->field_6).pCopy = pAVar8;
              *(long *)((long)pAVar10->pNtk->vObjs->pArray[*(pAVar10->vFanouts).pArray] + 0x40) =
                   plVar2[8];
              iVar6 = 0;
            }
            else {
              if (*(long *)((long)pvVar1 + 0x40) == 0) {
                *(Abc_Obj_t **)((long)pvVar1 + 0x40) = (Abc_Obj_t *)plVar2[8];
              }
              else {
                Abc_ObjAddFanin((Abc_Obj_t *)plVar2[8],(pAVar10->field_6).pCopy);
              }
              iVar6 = 0x13;
            }
            if ((iVar6 != 0x13) && (iVar6 != 0)) goto LAB_0085b4bd;
            lVar13 = lVar13 + 1;
          } while (lVar13 < (pAVar9->vFanins).nSize);
        }
        lVar14 = lVar14 + 1;
        pVVar12 = pNtkH->vBoxes;
      } while (lVar14 < pVVar12->nSize);
    }
    pVVar12 = pNtkL->vObjs;
    if (0 < pVVar12->nSize) {
      lVar14 = 0;
      do {
        pAVar9 = (Abc_Obj_t *)pVVar12->pArray[lVar14];
        if (((pAVar9 != (Abc_Obj_t *)0x0) && ((pAVar9->field_6).pTemp == (void *)0x0)) &&
           (uVar5 = *(uint *)&pAVar9->field_0x14 & 0xf, uVar5 != 3)) {
          Abc_NtkDupObj(pNtk,pAVar9,(uint)(uVar5 == 6));
        }
        lVar14 = lVar14 + 1;
        pVVar12 = pNtkL->vObjs;
      } while (lVar14 < pVVar12->nSize);
    }
    pVVar12 = pNtkL->vObjs;
    if (0 < pVVar12->nSize) {
      lVar14 = 0;
      do {
        plVar2 = (long *)pVVar12->pArray[lVar14];
        if ((plVar2 != (long *)0x0) && (0 < *(int *)((long)plVar2 + 0x1c))) {
          lVar13 = 0;
          do {
            if ((Abc_Obj_t *)plVar2[8] != (Abc_Obj_t *)0x0) {
              Abc_ObjAddFanin((Abc_Obj_t *)plVar2[8],
                              *(Abc_Obj_t **)
                               (*(long *)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) +
                                         (long)*(int *)(plVar2[4] + lVar13 * 4) * 8) + 0x40));
            }
            lVar13 = lVar13 + 1;
          } while (lVar13 < *(int *)((long)plVar2 + 0x1c));
        }
        lVar14 = lVar14 + 1;
        pVVar12 = pNtkL->vObjs;
      } while (lVar14 < pVVar12->nSize);
    }
    pAVar3 = pNtkH->pDesign;
    pNtkH->pDesign = (Abc_Des_t *)0x0;
    pVVar12 = pAVar3->vModules;
    if (pVVar12->nSize < 1) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
    }
    ppvVar4 = pVVar12->pArray;
    if ((Abc_Ntk_t *)*ppvVar4 != pNtkH) {
      __assert_fail("Vec_PtrEntry( pDesign->vModules, 0 ) == pNtkH",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcHie.c"
                    ,0x337,"Abc_Ntk_t *Abc_NtkInsertNewLogic(Abc_Ntk_t *, Abc_Ntk_t *)");
    }
    *ppvVar4 = pNtk;
    pNtk->pDesign = pAVar3;
    iVar6 = Abc_NtkCheck(pNtk);
    if (iVar6 == 0) {
      fwrite("Abc_NtkInsertNewLogic(): Network check has failed.\n",0x33,1,_stdout);
LAB_0085b4b5:
      Abc_NtkDelete(pNtk);
LAB_0085b4bd:
      pNtk = (Abc_Ntk_t *)0x0;
    }
    return pNtk;
  }
  lVar14 = 0;
LAB_0085b0db:
  pAVar9 = *(Abc_Obj_t **)
            (*(long *)(*(long *)(*pVVar12->pArray[lVar14] + 0x20) + 8) +
            (long)**(int **)((long)pVVar12->pArray[lVar14] + 0x20) * 8);
  pcVar7 = Abc_ObjName(pAVar9);
  pAVar8 = Abc_NtkFindNet(pNtkL,pcVar7);
  if ((pAVar8 != (Abc_Obj_t *)0x0) &&
     ((*(uint *)((long)pAVar8->pNtk->vObjs->pArray[*(pAVar8->vFanouts).pArray] + 0x14) & 0xf) == 3))
  goto code_r0x0085b13f;
  pcVar7 = Abc_ObjName(pAVar9);
  pcVar11 = "Error in Abc_NtkInsertNewLogic(): There is no PO corresponding to the PO %s.\n";
LAB_0085b4ab:
  printf(pcVar11,pcVar7);
  goto LAB_0085b4b5;
code_r0x0085b13f:
  if ((pAVar8->field_6).pTemp == (void *)0x0) {
    pcVar7 = Abc_ObjName(pAVar9);
    pAVar9 = Abc_NtkFindOrCreateNet(pNtk,pcVar7);
    (pAVar8->field_6).pCopy = pAVar9;
    Abc_NtkDupObj(pNtk,(Abc_Obj_t *)pAVar8->pNtk->vObjs->pArray[*(pAVar8->vFanouts).pArray],0);
  }
  lVar14 = lVar14 + 1;
  pVVar12 = pNtkH->vPos;
  if (pVVar12->nSize <= lVar14) goto LAB_0085b192;
  goto LAB_0085b0db;
}

Assistant:

Abc_Ntk_t * Abc_NtkInsertNewLogic( Abc_Ntk_t * pNtkH, Abc_Ntk_t * pNtkL )
{
    Abc_Des_t * pDesign;
    Abc_Ntk_t * pNtkNew;
    Abc_Obj_t * pObjH, * pObjL, * pNetH, * pNetL, * pTermH;
    int i, k;

    assert( Abc_NtkIsNetlist(pNtkH) );
    assert( Abc_NtkWhiteboxNum(pNtkH) == 0 );
    assert( Abc_NtkBlackboxNum(pNtkH) > 0 );

    assert( Abc_NtkIsNetlist(pNtkL) );
    assert( Abc_NtkWhiteboxNum(pNtkL) == 0 );
    assert( Abc_NtkBlackboxNum(pNtkL) == 0 );

    // prepare the logic network for copying
    Abc_NtkCleanCopy( pNtkL );

    // start the network
    pNtkNew = Abc_NtkAlloc( pNtkL->ntkType, pNtkL->ntkFunc, 1 );
    // duplicate the name and the spec
    pNtkNew->pName = Extra_UtilStrsav( pNtkH->pName );
    pNtkNew->pSpec = Extra_UtilStrsav( pNtkH->pSpec );

    // make sure every PI/PO has a PI/PO in the processed network
    Abc_NtkForEachPi( pNtkH, pObjH, i )
    {
        pNetH = Abc_ObjFanout0(pObjH);
        pNetL = Abc_NtkFindNet( pNtkL, Abc_ObjName(pNetH) );
        if ( pNetL == NULL || !Abc_ObjIsPi( Abc_ObjFanin0(pNetL) ) )
        {
            printf( "Error in Abc_NtkInsertNewLogic(): There is no PI corresponding to the PI %s.\n", Abc_ObjName(pNetH) );
            Abc_NtkDelete( pNtkNew );
            return NULL;
        }
        if ( pNetL->pCopy )
        {
            printf( "Error in Abc_NtkInsertNewLogic(): Primary input %s is repeated twice.\n", Abc_ObjName(pNetH) );
            Abc_NtkDelete( pNtkNew );
            return NULL;
        }
        // create the new net
        pNetL->pCopy = Abc_NtkFindOrCreateNet( pNtkNew, Abc_ObjName(pNetH) );
        Abc_NtkDupObj( pNtkNew, Abc_ObjFanin0(pNetL), 0 );
    }

    // make sure every BB has a PI/PO in the processed network
    Abc_NtkForEachBlackbox( pNtkH, pObjH, i )
    {
        // duplicate the box 
        Abc_NtkDupBox( pNtkNew, pObjH, 0 );
        pObjH->pCopy->pData = pObjH->pData;
        // create PIs
        Abc_ObjForEachFanout( pObjH, pTermH, k )
        {
            pNetH = Abc_ObjFanout0( pTermH );
            pNetL = Abc_NtkFindNet( pNtkL, Abc_ObjName(pNetH) );
            if ( pNetL == NULL || !Abc_ObjIsPi( Abc_ObjFanin0(pNetL) ) )
            {
                printf( "Error in Abc_NtkInsertNewLogic(): There is no PI corresponding to the inpout %s of blackbox %s.\n", Abc_ObjName(pNetH), Abc_ObjName(pObjH) );
                Abc_NtkDelete( pNtkNew );
                return NULL;
            }
            if ( pNetL->pCopy )
            {
                printf( "Error in Abc_NtkInsertNewLogic(): Box output %s is repeated twice.\n", Abc_ObjName(pNetH) );
                Abc_NtkDelete( pNtkNew );
                return NULL;
            }
            // create net and map the PI
            pNetL->pCopy = Abc_NtkFindOrCreateNet( pNtkNew, Abc_ObjName(pNetH) );
            Abc_ObjFanin0(pNetL)->pCopy = pTermH->pCopy;
        }
    }

    Abc_NtkForEachPo( pNtkH, pObjH, i )
    {
        pNetH = Abc_ObjFanin0(pObjH);
        pNetL = Abc_NtkFindNet( pNtkL, Abc_ObjName(pNetH) );
        if ( pNetL == NULL || !Abc_ObjIsPo( Abc_ObjFanout0(pNetL) ) )
        {
            printf( "Error in Abc_NtkInsertNewLogic(): There is no PO corresponding to the PO %s.\n", Abc_ObjName(pNetH) );
            Abc_NtkDelete( pNtkNew );
            return NULL;
        }
        if ( pNetL->pCopy )
            continue;
        // create the new net
        pNetL->pCopy = Abc_NtkFindOrCreateNet( pNtkNew, Abc_ObjName(pNetH) );
        Abc_NtkDupObj( pNtkNew, Abc_ObjFanout0(pNetL), 0 );
    }
    Abc_NtkForEachBlackbox( pNtkH, pObjH, i )
    {
        Abc_ObjForEachFanin( pObjH, pTermH, k )
        {
            char * pName;
            pNetH = Abc_ObjFanin0( pTermH );
            pName = Abc_ObjName(pNetH);
            pNetL = Abc_NtkFindNet( pNtkL, Abc_ObjName(pNetH) );
            if ( pNetL == NULL || !Abc_ObjIsPo( Abc_ObjFanout0(pNetL) ) )
            {
                printf( "There is no PO corresponding to the input %s of blackbox %s.\n", Abc_ObjName(pNetH), Abc_ObjName(pObjH) );
                Abc_NtkDelete( pNtkNew );
                return NULL;
            }
            // create net and map the PO
            if ( pNetL->pCopy )
            {
                if ( Abc_ObjFanout0(pNetL)->pCopy == NULL )
                    Abc_ObjFanout0(pNetL)->pCopy = pTermH->pCopy;
                else
                    Abc_ObjAddFanin( pTermH->pCopy, pNetL->pCopy );
                continue;
            }
            pNetL->pCopy = Abc_NtkFindOrCreateNet( pNtkNew, Abc_ObjName(pNetH) );
            Abc_ObjFanout0(pNetL)->pCopy = pTermH->pCopy;
        }
    }

    // duplicate other objects of the logic network
    Abc_NtkForEachObj( pNtkL, pObjL, i )
        if ( pObjL->pCopy == NULL && !Abc_ObjIsPo(pObjL) ) // skip POs feeding into PIs
            Abc_NtkDupObj( pNtkNew, pObjL, Abc_ObjIsNet(pObjL) );

    // connect objects
    Abc_NtkForEachObj( pNtkL, pObjL, i )
        Abc_ObjForEachFanin( pObjL, pNetL, k )
            if ( pObjL->pCopy )
                Abc_ObjAddFanin( pObjL->pCopy, pNetL->pCopy );

    // transfer the design
    pDesign = pNtkH->pDesign;  pNtkH->pDesign = NULL;
    assert( Vec_PtrEntry( pDesign->vModules, 0 ) == pNtkH );
    Vec_PtrWriteEntry( pDesign->vModules, 0, pNtkNew );
    pNtkNew->pDesign = pDesign;

    // check integrity
    if ( !Abc_NtkCheck( pNtkNew ) )
    {
        fprintf( stdout, "Abc_NtkInsertNewLogic(): Network check has failed.\n" );
        Abc_NtkDelete( pNtkNew );
        return NULL;
    }
    return pNtkNew;
}